

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form3_Merge(MergeForm3 Merge)

{
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  anon_class_8_1_a81546ea __f;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  bool bVar4;
  uint8_t uVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  reference image;
  code *in_RDI;
  Image output;
  uint32_t roiHeight;
  uint32_t roiWidth;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  size;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  undefined4 in_stack_fffffffffffffde8;
  value_type height;
  uint32_t in_stack_fffffffffffffdec;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  value_type vVar10;
  undefined4 in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  value_type vVar11;
  undefined4 in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  bool local_1da;
  uint32_t *in_stack_fffffffffffffe30;
  size_type sVar12;
  uint32_t *in_stack_fffffffffffffe38;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *this;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *in_stack_fffffffffffffe50;
  ImageTemplate<unsigned_char> local_120;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  pair<unsigned_int,_unsigned_int> local_bc;
  pair<unsigned_int,_unsigned_int> local_b4;
  pair<unsigned_int,_unsigned_int> local_ac;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_a0;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *local_88;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *local_70;
  uchar *local_68;
  uchar *local_60;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_58 [2];
  code *local_28;
  
  local_28 = in_RDI;
  Unit_Test::intensityArray(in_stack_fffffffffffffdec);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
            *)0x1dbdb4);
  local_60 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  local_68 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  __first._M_current._4_4_ = in_stack_fffffffffffffdfc;
  __first._M_current._0_4_ = in_stack_fffffffffffffdf8;
  __f.input._4_4_ = in_stack_fffffffffffffdec;
  __f.input._0_4_ = in_stack_fffffffffffffde8;
  local_70 = local_58;
  local_88 = (vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
              *)std::
                for_each<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,Function_Template::form3_Merge(PenguinV_Image::ImageTemplate<unsigned_char>(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,unsigned_int,unsigned_int))::__0>
                          (__first,in_stack_fffffffffffffdf0,__f);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator
            ((allocator<std::pair<unsigned_int,_unsigned_int>_> *)0x1dbe3d);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
           CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
           (allocator_type *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator
            ((allocator<std::pair<unsigned_int,_unsigned_int>_> *)0x1dbe66);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::operator[](local_58,0);
  local_ac = Unit_Test::imageSize
                       ((Image *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  pvVar6 = std::
           vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::operator[](&local_a0,0);
  std::pair<unsigned_int,_unsigned_int>::operator=(pvVar6,&local_ac);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::operator[](local_58,1);
  local_b4 = Unit_Test::imageSize
                       ((Image *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  pvVar6 = std::
           vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::operator[](&local_a0,1);
  std::pair<unsigned_int,_unsigned_int>::operator=(pvVar6,&local_b4);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::operator[](local_58,2);
  local_bc = Unit_Test::imageSize
                       ((Image *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  pvVar6 = std::
           vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::operator[](&local_a0,2);
  std::pair<unsigned_int,_unsigned_int>::operator=(pvVar6,&local_bc);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1dbf83);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1dbf98);
  Unit_Test::generateRoi
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
             in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  this = local_58;
  pvVar7 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](this,0);
  this_00 = &local_d8;
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,0);
  vVar1 = *pvVar8;
  this_01 = &local_f0;
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_01,0);
  vVar2 = *pvVar8;
  sVar12 = 1;
  pvVar9 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](this,1);
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,sVar12);
  vVar3 = *pvVar8;
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_01,sVar12);
  height = *pvVar8;
  sVar12 = 2;
  image = std::
          vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
          ::operator[](this,2);
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,sVar12);
  vVar10 = *pvVar8;
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_01,sVar12);
  vVar11 = *pvVar8;
  (*local_28)(&local_120,pvVar7,vVar1,vVar2,pvVar9,vVar3);
  bVar4 = Unit_Test::verifyImage
                    ((Image *)CONCAT44(in_stack_fffffffffffffe04,vVar11),
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffffdfc,vVar10),SUB81((ulong)image >> 0x38,0));
  local_1da = false;
  if (bVar4) {
    bVar4 = Unit_Test::equalSize(image,in_stack_fffffffffffffdec,height);
    local_1da = false;
    if (bVar4) {
      uVar5 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(&local_120);
      local_1da = uVar5 == '\x03';
    }
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1dc1c6);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffe04,vVar11));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffe04,vVar11));
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             *)CONCAT44(in_stack_fffffffffffffe04,vVar11));
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)CONCAT44(in_stack_fffffffffffffe04,vVar11));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffe04,vVar11));
  return local_1da;
}

Assistant:

bool form3_Merge(MergeForm3 Merge)
    {
        const std::vector < uint8_t > intensity = intensityArray( 3 );
        std::vector < PenguinV_Image::Image > input;
        std::for_each( intensity.begin(), intensity.end(), [&]( uint8_t value )
        { input.push_back( uniformImage( value ) ); } );

        std::vector < std::pair <uint32_t, uint32_t> > size( 3 );
        size[0] = imageSize( input[0] );
        size[1] = imageSize( input[1] );
        size[2] = imageSize( input[2] );

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( size, roiX, roiY, roiWidth, roiHeight );

        const PenguinV_Image::Image output = Merge( input[0], roiX[0], roiY[0], input[1], roiX[1], roiY[1], input[2], roiX[2], roiY[2], roiWidth, roiHeight );

        return verifyImage( output, intensity, false ) && equalSize( output, roiWidth, roiHeight ) && (output.colorCount() == PenguinV_Image::RGB);
    }